

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.h
# Opt level: O1

Vec3 __thiscall cert::World::light_hit(World *this,Vec3 point,Vec3 normal)

{
  Light *pLVar1;
  Shape *pSVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  float extraout_var;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  float fVar9;
  undefined8 extraout_XMM0_Qa;
  double dVar10;
  float fVar11;
  float fVar12;
  Vec3 VVar13;
  float local_bc;
  undefined8 local_b8;
  float local_b0;
  undefined4 local_ac;
  undefined8 local_a8;
  float local_a0;
  float local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 uStack_88;
  float fStack_84;
  undefined8 local_80;
  float local_78;
  undefined8 local_74;
  float local_6c;
  undefined8 local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_a0 = normal.z;
  local_b0 = point.z;
  local_b8 = point._0_8_;
  local_a8 = normal._0_8_;
  if ((this->lights).m_size == 0) {
    local_bc = 0.0;
    local_98 = 0;
  }
  else {
    local_98 = 0;
    uStack_90 = 0;
    local_bc = 0.0;
    uVar6 = 0;
    do {
      pLVar1 = (this->lights).m_data[uVar6];
      uVar4 = (*pLVar1->_vptr_Light[2])(pLVar1,&local_b8,&local_a8);
      if ((uVar4 & 1) != 0) {
        pLVar1 = (this->lights).m_data[uVar6];
        fVar11 = (pLVar1->position).x - (float)local_b8;
        fVar12 = (pLVar1->position).y - local_b8._4_4_;
        fVar9 = (pLVar1->position).z - local_b0;
        local_68 = extraout_XMM0_Qa;
        dVar10 = sqrt((double)(ulong)(uint)(fVar9 * fVar9 + fVar11 * fVar11 + fVar12 * fVar12));
        pLVar1 = (this->lights).m_data[uVar6];
        fVar11 = (pLVar1->position).x - (float)local_b8;
        local_58 = ZEXT416((uint)fVar11);
        fVar9 = (pLVar1->position).y - local_b8._4_4_;
        local_48 = ZEXT416((uint)fVar9);
        local_ac = SUB84(dVar10,0);
        local_9c = (pLVar1->position).z - local_b0;
        local_80 = local_b8;
        local_78 = local_b0;
        dVar10 = sqrt((double)(ulong)(uint)(local_9c * local_9c + fVar11 * fVar11 + fVar9 * fVar9));
        fVar9 = SUB84(dVar10,0);
        local_6c = local_9c / fVar9;
        local_74 = CONCAT44((float)local_48._0_4_ / fVar9,(float)local_58._0_4_ / fVar9);
        bVar8 = (this->shapes).m_size != 0;
        if (bVar8) {
          pSVar2 = *(this->shapes).m_data;
          iVar5 = (*pSVar2->_vptr_Shape[2])(pSVar2,&local_80);
          if ((char)iVar5 != '\0') goto LAB_00104cbd;
          uVar7 = 1;
          do {
            uVar3 = (this->shapes).m_size;
            bVar8 = uVar7 < uVar3;
            if (uVar3 <= uVar7) break;
            pSVar2 = (this->shapes).m_data[uVar7];
            iVar5 = (*pSVar2->_vptr_Shape[2])(pSVar2,&local_80);
            uVar7 = uVar7 + 1;
          } while ((char)iVar5 == '\0');
        }
        if (!bVar8) {
          fStack_84 = local_98._4_4_ + local_68._4_4_;
          local_98 = CONCAT44(local_98._4_4_ + (float)local_68,extraout_var + (float)local_98);
          local_bc = local_bc + local_68._4_4_;
          uStack_88 = 0;
        }
      }
LAB_00104cbd:
      uVar6 = uVar6 + 1;
    } while (uVar6 < (this->lights).m_size);
  }
  VVar13.z = local_bc;
  VVar13.x = (float)local_98;
  VVar13.y = local_98._4_4_;
  return VVar13;
}

Assistant:

constexpr Vec3 light_hit (Vec3 point, Vec3 normal) const
	{
		Vec3 attenuation = VEC3_ZERO;
		for (int i = 0; i < lights.size (); i++)
		{
			auto rec = lights.at (i)->visible (point, normal);
			if (rec.visible)
			{
				float distance = (lights.at (i)->position - point).length ();
				if (!intersects (lights.at (i)->ray_to_light (point), 0.001, distance))
				{
					attenuation += rec.attenuation;
				}
			}
		}
		return attenuation;
	}